

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf_query.c
# Opt level: O0

void free_dwarf_offsets_chain(Dwarf_Debug dbg,Dwarf_Chain_2_conflict head_chain)

{
  Dwarf_Chain_2 pDVar1;
  Dwarf_Chain_2_conflict next;
  Dwarf_Chain_2_conflict cur;
  Dwarf_Chain_2_conflict head_chain_local;
  Dwarf_Debug dbg_local;
  
  next = head_chain;
  while (next != (Dwarf_Chain_2_conflict)0x0) {
    pDVar1 = next->ch_next;
    dwarf_dealloc(dbg,next,0x3d);
    next = pDVar1;
  }
  return;
}

Assistant:

static void
free_dwarf_offsets_chain(Dwarf_Debug dbg, Dwarf_Chain_2 head_chain)
{
    Dwarf_Chain_2 cur = head_chain;
    Dwarf_Chain_2 next = 0;

    for ( ; cur ; cur = next ) {
        next = cur->ch_next;
        dwarf_dealloc(dbg, cur, DW_DLA_CHAIN_2);
    }
}